

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

appender fmt::v10::detail::
         write_significand<fmt::v10::appender,char,char_const*,fmt::v10::detail::digit_grouping<char>>
                   (appender out,char *significand,int significand_size,int integral_size,
                   char decimal_point,digit_grouping<char> *grouping)

{
  bool bVar1;
  type tVar2;
  char *s;
  undefined8 in_RDI;
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> buffer;
  digit_grouping<char> *in_stack_000005c0;
  basic_string_view<char> in_stack_000005c8;
  back_insert_iterator<fmt::v10::detail::buffer<char>_> in_stack_000005d8;
  buffer<char> *in_stack_fffffffffffffd18;
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> *in_stack_fffffffffffffd20;
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> *this;
  back_insert_iterator<fmt::v10::detail::buffer<char>_> in_stack_fffffffffffffd28;
  undefined8 in_stack_fffffffffffffd30;
  char decimal_point_00;
  undefined8 in_stack_fffffffffffffd38;
  char *in_stack_fffffffffffffd40;
  back_insert_iterator<fmt::v10::detail::buffer<char>_> in_stack_fffffffffffffd48;
  basic_string_view<char> local_298;
  undefined8 local_288;
  back_insert_iterator<fmt::v10::detail::buffer<char>_> local_280;
  allocator<char> local_259;
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> local_258;
  undefined8 local_40;
  undefined8 local_18;
  back_insert_iterator<fmt::v10::detail::buffer<char>_> local_10;
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> *local_8;
  
  decimal_point_00 = (char)((ulong)in_stack_fffffffffffffd30 >> 0x38);
  local_18 = in_RDI;
  bVar1 = digit_grouping<char>::has_separator((digit_grouping<char> *)0x375a94);
  if (bVar1) {
    std::allocator<char>::allocator();
    basic_memory_buffer<char,_500UL,_std::allocator<char>_>::basic_memory_buffer
              (in_stack_fffffffffffffd20,(allocator<char> *)in_stack_fffffffffffffd18);
    std::allocator<char>::~allocator(&local_259);
    appender::back_insert_iterator((appender *)in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
    local_280.container =
         (buffer<char> *)
         write_significand<fmt::v10::appender,char>
                   (in_stack_fffffffffffffd48.container,in_stack_fffffffffffffd40,
                    (int)((ulong)in_stack_fffffffffffffd38 >> 0x20),(int)in_stack_fffffffffffffd38,
                    decimal_point_00);
    local_288 = local_18;
    s = buffer<char>::data(&local_258.super_buffer<char>);
    tVar2 = to_unsigned<int>(0);
    basic_string_view<char>::basic_string_view(&local_298,s,(ulong)tVar2);
    digit_grouping<char>::apply<fmt::v10::appender,char>
              (in_stack_000005c0,(appender)in_stack_000005d8.container,in_stack_000005c8);
    this = &local_258;
    buffer<char>::data(&this->super_buffer<char>);
    local_8 = this;
    local_10.container =
         (buffer<char> *)
         copy_str_noinline<char,char*,fmt::v10::appender>
                   ((char *)this,in_stack_fffffffffffffd18,in_stack_fffffffffffffd28.container);
    basic_memory_buffer<char,_500UL,_std::allocator<char>_>::~basic_memory_buffer(this);
  }
  else {
    local_40 = local_18;
    local_10.container =
         (buffer<char> *)
         write_significand<fmt::v10::appender,char>
                   (in_stack_fffffffffffffd48.container,in_stack_fffffffffffffd40,
                    (int)((ulong)in_stack_fffffffffffffd38 >> 0x20),(int)in_stack_fffffffffffffd38,
                    decimal_point_00);
  }
  return (appender)(back_insert_iterator<fmt::v10::detail::buffer<char>_>)local_10.container;
}

Assistant:

FMT_CONSTEXPR20 auto write_significand(OutputIt out, T significand,
                                       int significand_size, int integral_size,
                                       Char decimal_point,
                                       const Grouping& grouping) -> OutputIt {
  if (!grouping.has_separator()) {
    return write_significand(out, significand, significand_size, integral_size,
                             decimal_point);
  }
  auto buffer = basic_memory_buffer<Char>();
  write_significand(buffer_appender<Char>(buffer), significand,
                    significand_size, integral_size, decimal_point);
  grouping.apply(
      out, basic_string_view<Char>(buffer.data(), to_unsigned(integral_size)));
  return detail::copy_str_noinline<Char>(buffer.data() + integral_size,
                                         buffer.end(), out);
}